

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_iwmmxt_setpsr_nz(TCGContext_conflict1 *tcg_ctx)

{
  TCGv_i32 retval;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx_local;
  
  retval = tcg_temp_new_i32(tcg_ctx);
  gen_helper_iwmmxt_setpsr_nz(tcg_ctx,retval,tcg_ctx->cpu_M0);
  store_cpu_offset(tcg_ctx,retval,0x2fac);
  return;
}

Assistant:

static void gen_op_iwmmxt_setpsr_nz(TCGContext *tcg_ctx)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_iwmmxt_setpsr_nz(tcg_ctx, tmp, tcg_ctx->cpu_M0);
    store_cpu_field(tcg_ctx, tmp, iwmmxt.cregs[ARM_IWMMXT_wCASF]);
}